

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void __thiscall FDecalLib::ParseSlider(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  FDecalSliderAnim *this_00;
  char *pcVar2;
  FDecalSliderAnim *local_58;
  FDecalSliderAnim *local_50;
  FDecalSliderAnim *slider;
  int local_38;
  int local_34;
  int takeTime;
  int startTime;
  double distY;
  double distX;
  FString sliderName;
  FScanner *sc_local;
  FDecalLib *this_local;
  
  sliderName.Chars = (char *)sc;
  FString::FString((FString *)&distX);
  distY = 0.0;
  _takeTime = 0.0;
  local_34 = 0;
  local_38 = 0;
  FScanner::MustGetString((FScanner *)sliderName.Chars);
  FString::operator=((FString *)&distX,*sliderName.Chars);
  FScanner::MustGetStringName((FScanner *)sliderName.Chars,"{");
  while( true ) {
    FScanner::MustGetString((FScanner *)sliderName.Chars);
    bVar1 = FScanner::Compare((FScanner *)sliderName.Chars,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare((FScanner *)sliderName.Chars,"SlideStart");
    if (bVar1) {
      FScanner::MustGetFloat((FScanner *)sliderName.Chars);
      local_34 = (int)(*(double *)(sliderName.Chars + 0x18) * 35.0);
    }
    else {
      bVar1 = FScanner::Compare((FScanner *)sliderName.Chars,"SlideTime");
      if (bVar1) {
        FScanner::MustGetFloat((FScanner *)sliderName.Chars);
        local_38 = (int)(*(double *)(sliderName.Chars + 0x18) * 35.0);
      }
      else {
        bVar1 = FScanner::Compare((FScanner *)sliderName.Chars,"DistX");
        if (bVar1) {
          FScanner::MustGetFloat((FScanner *)sliderName.Chars);
          pcVar2 = FString::GetChars((FString *)&distX);
          Printf("DistX in slider decal %s is unsupported\n",pcVar2);
        }
        else {
          bVar1 = FScanner::Compare((FScanner *)sliderName.Chars,"DistY");
          if (bVar1) {
            FScanner::MustGetFloat((FScanner *)sliderName.Chars);
            _takeTime = *(double *)(sliderName.Chars + 0x18);
          }
          else {
            FScanner::ScriptError
                      ((FScanner *)sliderName.Chars,"Unknown slider parameter \'%s\'",
                       *(undefined8 *)sliderName.Chars);
          }
        }
      }
    }
  }
  if ((_takeTime != 0.0) || (NAN(_takeTime))) {
    this_00 = (FDecalSliderAnim *)operator_new(0x20);
    pcVar2 = FString::operator_cast_to_char_((FString *)&distX);
    FDecalSliderAnim::FDecalSliderAnim(this_00,pcVar2);
    *(int *)&(this_00->super_FDecalAnimator).field_0xc = local_34;
    this_00->SlideTime = local_38;
    this_00->DistY = _takeTime;
    local_58 = this_00;
    local_50 = this_00;
    TArray<FDecalAnimator_*,_FDecalAnimator_*>::Push
              (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,
               (FDecalAnimator **)&local_58);
  }
  FString::~FString((FString *)&distX);
  return;
}

Assistant:

void FDecalLib::ParseSlider (FScanner &sc)
{
	FString sliderName;
	double distX = 0, distY = 0;
	int startTime = 0, takeTime = 0;

	sc.MustGetString ();
	sliderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			if ((/*distX |*/ distY) != 0)
			{
				FDecalSliderAnim *slider = new FDecalSliderAnim (sliderName);
				slider->SlideStart = startTime;
				slider->SlideTime = takeTime;
				/*slider->DistX = distX;*/
				slider->DistY = distY;
				Animators.Push (slider);
			}
			break;
		}
		else if (sc.Compare ("SlideStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("SlideTime"))
		{
			sc.MustGetFloat ();
			takeTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("DistX"))
		{
			sc.MustGetFloat ();	// must remain to avoid breaking definitions that accidentally used DistX
			Printf ("DistX in slider decal %s is unsupported\n", sliderName.GetChars());
		}
		else if (sc.Compare ("DistY"))
		{
			sc.MustGetFloat ();
			distY = sc.Float;
		}
		else
		{
			sc.ScriptError ("Unknown slider parameter '%s'", sc.String);
		}
	}
}